

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver1L1Q1P<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                    *__return_storage_ptr__,
                   vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                   *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                           *plPair,
                   vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                   *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                          *lCPair)

{
  float *this;
  float *this_00;
  float *this_01;
  float *this_02;
  float *this_03;
  float *this_04;
  float *this_05;
  float *this_06;
  uint uVar1;
  size_type sVar2;
  ostream *this_07;
  reference pvVar3;
  reference pvVar4;
  Scalar *pSVar5;
  reference pvVar6;
  Scalar *pSVar7;
  CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *pCVar8;
  double dVar9;
  float fVar10;
  Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> PVar11;
  XprTypeNested local_ef8;
  Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_ef0;
  Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_ee0;
  value_type local_ec8;
  Scalar local_e88;
  Scalar local_e84;
  Scalar local_e80;
  Scalar local_e7c;
  Scalar local_e78;
  Scalar local_e74;
  Scalar local_e70;
  Scalar local_e6c;
  Scalar local_e68;
  Scalar local_e64;
  float local_e60;
  float local_e5c;
  Scalar local_e58;
  Scalar local_e54;
  float local_e50;
  float local_e4c;
  CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> local_e48;
  XprTypeNested local_e28;
  Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_e20;
  Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_e10;
  value_type local_df8;
  Scalar local_db0;
  Scalar local_dac;
  Scalar local_da8;
  Scalar local_da4;
  Scalar local_da0;
  Scalar local_d9c;
  Scalar local_d98;
  Scalar local_d94;
  Scalar local_d90;
  Scalar local_d8c;
  float local_d88;
  float local_d84;
  Scalar local_d80;
  Scalar local_d7c;
  float local_d78;
  float local_d74;
  CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> local_d70;
  float local_d4c;
  float local_d48;
  float s2;
  float s1;
  float c;
  float b;
  float a;
  float l26;
  float l25;
  float l24;
  float l23;
  float l22;
  float l21;
  float l16;
  float l15;
  float l14;
  float l13;
  float l12;
  float l11;
  Matrix<float,_4,_4,_0,_4,_4> TF2;
  Matrix<float,_4,_4,_0,_4,_4> TF1;
  Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> local_c78;
  undefined1 local_c68 [8];
  Matrix<float,_6,_1,_0,_6,_1> L2_2;
  Matrix<float,_6,_1,_0,_6,_1> L1_2;
  Type local_c00;
  ColXpr local_bc8;
  Type local_b98;
  Matrix<float,_3,_1,_0,_3,_1> local_b34;
  Matrix<float,_3,_3,_0,_3,_3> local_b28;
  int local_b04;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
  local_b00;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_ae0;
  Type local_a88;
  Type local_a50;
  Type local_a18;
  Type local_9e0;
  Type local_9a8;
  Type local_970;
  ColXpr local_938;
  Type local_908;
  Matrix<float,_3,_1,_0,_3,_1> local_8a4;
  Matrix<float,_3,_3,_0,_3,_3> local_898;
  int local_874;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
  local_870;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_850;
  Type local_7f8;
  Type local_7c0;
  Type local_788;
  Type local_750;
  undefined1 local_718 [8];
  Matrix<float,_6,_6,_0,_6,_6> transLineV;
  Matrix<float,_6,_6,_0,_6,_6> transLineU;
  Matrix<float,_4,_4,_0,_4,_4> TU;
  Matrix<float,_4,_4,_0,_4,_4> TV;
  Matrix<float,_4,_1,_0,_4,_1> local_568;
  Matrix<float,_4,_1,_0,_4,_1> local_558;
  Matrix<float,_4,_1,_0,_4,_1> local_548;
  undefined1 local_530 [8];
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  predTrans;
  RealScalar local_4dc;
  Type local_4d8;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_49c [12];
  Type local_490;
  undefined1 local_458 [8];
  Matrix<float,_6,_1,_0,_6,_1> L2;
  Matrix<float,3,1,0,3,1> local_424 [8];
  Matrix<float,_3,_1,_0,_3,_1> D2;
  RealScalar local_3dc;
  Type local_3d8;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_39c [12];
  Type local_390;
  undefined1 local_358 [8];
  Matrix<float,_6,_1,_0,_6,_1> L1;
  Matrix<float,3,1,0,3,1> local_324 [8];
  Matrix<float,_3,_1,_0,_3,_1> D1;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_2e0;
  Type local_290;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_258;
  Type local_208;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_1d0;
  Type local_180;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_148;
  undefined1 local_f8 [8];
  Matrix<float,_3,_1,_0,_3,_1> tQ2;
  Matrix<float,_3,_1,_0,_3,_1> tQ1;
  Matrix<float,_3,_1,_0,_3,_1> tP2;
  undefined1 local_c8 [8];
  Matrix<float,_3,_1,_0,_3,_1> tP1;
  Matrix<float,_4,_1,_0,_4,_1> R2_B;
  Matrix<float,_4,_1,_0,_4,_1> R1_B;
  Matrix<float,_4,_1,_0,_4,_1> Q2;
  Matrix<float,_4,_1,_0,_4,_1> Q1;
  Matrix<float,_4,_1,_0,_4,_1> Pi_B;
  Matrix<float,_4,_1,_0,_4,_1> Pi;
  Matrix<float,_4,_1,_0,_4,_1> P1_B;
  Matrix<float,_4,_1,_0,_4,_1> P1;
  vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
  *lCPair_local;
  vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
  *lPair_local;
  vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
  *plPair_local;
  vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
  *ptPair_local;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  *out;
  
  sVar2 = std::
          vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
          ::size(ptPair);
  if (sVar2 != 0) {
    sVar2 = std::
            vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
            ::size(lPair);
    if (sVar2 != 0) {
      sVar2 = std::
              vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
              ::size(plPair);
      if (sVar2 != 0) {
        this = P1_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 2;
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this);
        this_00 = Pi.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 2;
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_00);
        this_01 = Pi_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 2;
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_01);
        this_02 = Q1.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 2;
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_02);
        this_03 = Q2.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 2;
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_03);
        this_04 = R1_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 2;
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_04);
        this_05 = R2_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 2;
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_05);
        this_06 = tP1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 2;
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_06);
        pvVar3 = std::
                 vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                 ::operator[](ptPair,0);
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                  ((Matrix<float,_4,_1,_0,_4,_1> *)this,&pvVar3->first);
        pvVar3 = std::
                 vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                 ::operator[](ptPair,0);
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                  ((Matrix<float,_4,_1,_0,_4,_1> *)this_00,&pvVar3->second);
        pvVar3 = std::
                 vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                 ::operator[](plPair,0);
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                  ((Matrix<float,_4,_1,_0,_4,_1> *)this_01,&pvVar3->first);
        pvVar3 = std::
                 vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                 ::operator[](plPair,0);
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                  ((Matrix<float,_4,_1,_0,_4,_1> *)this_02,&pvVar3->second);
        pvVar4 = std::
                 vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                 ::operator[](lPair,0);
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                  ((Matrix<float,_4,_1,_0,_4,_1> *)this_03,(Matrix<float,_4,_1,_0,_4,_1> *)pvVar4);
        pvVar4 = std::
                 vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                 ::operator[](lPair,0);
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                  ((Matrix<float,_4,_1,_0,_4,_1> *)this_04,&(pvVar4->first).second);
        pvVar4 = std::
                 vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                 ::operator[](lPair,0);
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                  ((Matrix<float,_4,_1,_0,_4,_1> *)this_05,&(pvVar4->second).first);
        pvVar4 = std::
                 vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                 ::operator[](lPair,0);
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                  ((Matrix<float,_4,_1,_0,_4,_1> *)this_06,&(pvVar4->second).second);
        tP1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1].
        _3_1_ = 0;
        std::
        vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
        ::vector(__return_storage_ptr__);
        Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)local_c8);
        Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
                  ((Matrix<float,_3,_1,_0,_3,_1> *)
                   (tQ1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
                    .array + 1));
        Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
                  ((Matrix<float,_3,_1,_0,_3,_1> *)
                   (tQ2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
                    .array + 1));
        Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)local_f8);
        Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
                  (&local_180,
                   (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                   (Q2.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array + 2),3);
        pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                            (Q2.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                             m_storage.m_data.array + 2),3);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
                  (&local_148,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&local_180
                   ,pSVar5);
        Eigen::Matrix<float,3,1,0,3,1>::operator=
                  ((Matrix<float,3,1,0,3,1> *)local_c8,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                    *)&local_148);
        Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
                  (&local_208,
                   (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                   (R1_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                    m_data.array + 2),3);
        pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                            (R1_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                             m_storage.m_data.array + 2),3);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
                  (&local_1d0,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&local_208
                   ,pSVar5);
        Eigen::Matrix<float,3,1,0,3,1>::operator=
                  ((Matrix<float,3,1,0,3,1> *)
                   (tQ1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
                    .array + 1),
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                    *)&local_1d0);
        Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
                  (&local_290,
                   (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                   (R2_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                    m_data.array + 2),3);
        pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                            (R2_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                             m_storage.m_data.array + 2),3);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
                  (&local_258,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&local_290
                   ,pSVar5);
        Eigen::Matrix<float,3,1,0,3,1>::operator=
                  ((Matrix<float,3,1,0,3,1> *)
                   (tQ2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
                    .array + 1),
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                    *)&local_258);
        Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
                  ((Type *)(D1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                            .m_data.array + 1),
                   (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                   (tP1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
                    .array + 2),3);
        pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                            (tP1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array + 2),3);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
                  (&local_2e0,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)
                   (D1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                    array + 1),pSVar5);
        Eigen::Matrix<float,3,1,0,3,1>::operator=
                  ((Matrix<float,3,1,0,3,1> *)local_f8,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                    *)&local_2e0);
        Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
                  ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                    *)(L1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array + 4),
                   (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
                   (tQ1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
                    .array + 1),(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_c8);
        Eigen::Matrix<float,3,1,0,3,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
                  (local_324,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    *)(L1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array + 4));
        Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)local_358);
        Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                  (&local_390,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_358,3);
        Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
                  ((Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> *)&local_390,
                   (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_324);
        Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
                  (local_39c,
                   (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                   (tQ1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
                    .array + 1));
        Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
                  (&local_3d8,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_358,3);
        Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
                  ((Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> *)&local_3d8,
                   (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_39c);
        Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                  ((Type *)(D2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                            .m_data.array + 1),
                   (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_358,3);
        local_3dc = Eigen::
                    MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
                    norm((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                          *)(D2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array + 1));
        Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
                  ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_358,&local_3dc);
        Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
                  ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                    *)(L2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array + 4),(MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)local_f8,
                   (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                   (tQ2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
                    .array + 1));
        Eigen::Matrix<float,3,1,0,3,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
                  (local_424,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    *)(L2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array + 4));
        Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)local_458);
        Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                  (&local_490,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_458,3);
        Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
                  ((Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> *)&local_490,
                   (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_424);
        Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
                  (local_49c,(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_f8);
        Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
                  (&local_4d8,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_458,3);
        Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
                  ((Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> *)&local_4d8,
                   (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_49c);
        Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                  ((Type *)&predTrans.
                            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_458,3);
        local_4dc = Eigen::
                    MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
                    norm((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                          *)&predTrans.
                             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
                  ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_458,&local_4dc);
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix
                  (&local_548,
                   (Matrix<float,_4,_1,_0,_4,_1> *)
                   (P1_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                    m_data.array + 2));
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix
                  (&local_558,
                   (Matrix<float,_4,_1,_0,_4,_1> *)
                   (Pi.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array + 2));
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix
                  (&local_568,
                   (Matrix<float,_4,_1,_0,_4,_1> *)
                   (Pi_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                    m_data.array + 2));
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix
                  ((Matrix<float,_4,_1,_0,_4,_1> *)
                   (TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                    array + 0xe),
                   (Matrix<float,_4,_1,_0,_4,_1> *)
                   (Q1.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array + 2));
        getPredefinedTransformations1L1Q1P<float>
                  ((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                    *)local_530,&local_548,&local_558,&local_568,
                   (Matrix<float,_4,_1,_0,_4,_1> *)
                   (TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                    array + 0xe));
        pvVar6 = std::
                 vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                 ::back((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                         *)local_530);
        Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
                  ((Matrix<float,_4,_4,_0,_4,_4> *)
                   (TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                    array + 0xe),pvVar6);
        std::
        vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
        ::pop_back((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                    *)local_530);
        pvVar6 = std::
                 vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                 ::back((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                         *)local_530);
        Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
                  ((Matrix<float,_4,_4,_0,_4,_4> *)
                   (transLineU.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array + 0x22),pvVar6);
        std::
        vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
        ::pop_back((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                    *)local_530);
        Eigen::Matrix<float,_6,_6,_0,_6,_6>::Matrix
                  ((Matrix<float,_6,_6,_0,_6,_6> *)
                   (transLineV.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array + 0x22));
        Eigen::Matrix<float,_6,_6,_0,_6,_6>::Matrix((Matrix<float,_6,_6,_0,_6,_6> *)local_718);
        Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::setZero
                  ((DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
                   (transLineV.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array + 0x22));
        Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::setZero
                  ((DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)local_718);
        Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                  (&local_750,
                   (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                   (transLineU.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array + 0x22),3,3);
        Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
                  (&local_788,
                   (DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)
                   (transLineV.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array + 0x22),3,3);
        Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_788,
                   (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                   &local_750);
        Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                  (&local_7c0,
                   (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                   (transLineU.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array + 0x22),3,3);
        Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomRightCorner<int,int>
                  (&local_7f8,
                   (DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)
                   (transLineV.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array + 0x22),3,3);
        Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_7f8,
                   (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                   &local_7c0);
        local_874 = -1;
        Eigen::DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::col
                  (&local_938,
                   (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                   (transLineU.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array + 0x22),3);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
                  (&local_908,
                   (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)
                   &local_938,3);
        Eigen::Matrix<float,3,1,0,3,1>::
        Matrix<Eigen::Block<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,4,1,true>,_1,1,false>>
                  ((Matrix<float,3,1,0,3,1> *)&local_8a4,
                   (EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                    *)&local_908);
        getSkew<float>(&local_898,&local_8a4);
        Eigen::operator*(&local_870,&local_874,(StorageBaseType *)&local_898);
        Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                  (&local_970,
                   (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                   (transLineU.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array + 0x22),3,3);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>>
        ::operator*(&local_850,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>>
                     *)&local_870,
                    (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *
                    )&local_970);
        Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomLeftCorner<int,int>
                  (&local_9a8,
                   (DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)
                   (transLineV.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array + 0x22),3,3);
        Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_9a8,
                   (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                    *)&local_850);
        Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                  (&local_9e0,
                   (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                   (TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                    array + 0xe),3,3);
        Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
                  (&local_a18,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_718,3,3);
        Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_a18,
                   (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                   &local_9e0);
        Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                  (&local_a50,
                   (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                   (TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                    array + 0xe),3,3);
        Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomRightCorner<int,int>
                  (&local_a88,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_718,3,3);
        Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_a88,
                   (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                   &local_a50);
        local_b04 = -1;
        Eigen::DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::col
                  (&local_bc8,
                   (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                   (TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                    array + 0xe),3);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
                  (&local_b98,
                   (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)
                   &local_bc8,3);
        Eigen::Matrix<float,3,1,0,3,1>::
        Matrix<Eigen::Block<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,4,1,true>,_1,1,false>>
                  ((Matrix<float,3,1,0,3,1> *)&local_b34,
                   (EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                    *)&local_b98);
        getSkew<float>(&local_b28,&local_b34);
        Eigen::operator*(&local_b00,&local_b04,(StorageBaseType *)&local_b28);
        Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                  (&local_c00,
                   (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                   (TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                    array + 0xe),3,3);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>>
        ::operator*(&local_ae0,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>>
                     *)&local_b00,
                    (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *
                    )&local_c00);
        Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomLeftCorner<int,int>
                  ((Type *)(L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),
                   (DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_718,3,3);
        Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)
                   (L1_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array + 4),
                   (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                    *)&local_ae0);
        Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix
                  ((Matrix<float,_6,_1,_0,_6,_1> *)
                   (L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array + 4));
        Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)local_c68);
        local_c78 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                              ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)
                               (transLineV.
                                super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array + 0x22),
                               (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_358);
        Eigen::Matrix<float,6,1,0,6,1>::operator=
                  ((Matrix<float,6,1,0,6,1> *)
                   (L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array + 4),
                   (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                    *)&local_c78);
        PVar11 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                           ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_718,
                            (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_458);
        TF1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
        _56_8_ = PVar11.m_lhs;
        Eigen::Matrix<float,6,1,0,6,1>::operator=
                  ((Matrix<float,6,1,0,6,1> *)local_c68,
                   (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                    *)(TF1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                       m_data.array + 0xe));
        Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
                  ((Matrix<float,_4,_4,_0,_4,_4> *)
                   (TF2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
                    .array + 0xe));
        Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix((Matrix<float,_4,_4,_0,_4,_4> *)&l12);
        Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::setIdentity
                  ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                   (TF2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
                    .array + 0xe),4,4);
        Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::setIdentity
                  ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&l12,4,4);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                            (L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array + 4),0);
        l13 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                            (L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array + 4),1);
        l14 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                            (L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array + 4),2);
        l15 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                            (L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array + 4),3);
        l16 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                            (L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array + 4),4);
        l21 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                            (L2_2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array + 4),5);
        l22 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_c68,0);
        l23 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_c68,1);
        l24 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_c68,2);
        l25 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_c68,3);
        l26 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_c68,4);
        a = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_c68,5);
        b = *pSVar7;
        c = l22 * l25 + ((((l15 * b - l16 * l23) - l14 * a) - l21 * l24) - l13 * l26);
        s1 = ((l16 + l16) * l24 + ((l13 + l13) * a - (l14 + l14) * l26)) - (l21 + l21) * l23;
        s2 = l22 * l25 + l21 * l24 + l16 * l23 + l15 * b + l13 * l26 + l14 * a;
        fVar10 = -s1;
        dVar9 = std::sqrt((double)(ulong)(uint)(s1 * s1 + c * -4.0 * s2));
        local_d48 = (fVar10 - SUB84(dVar9,0)) / (c + c);
        fVar10 = -s1;
        dVar9 = std::sqrt((double)(ulong)(uint)(s1 * s1 + c * -4.0 * s2));
        local_d4c = (fVar10 + SUB84(dVar9,0)) / (c + c);
        uVar1 = std::isnan((double)(ulong)(uint)local_d48);
        if ((uVar1 & 1) == 0) {
          local_d74 = (1.0 - local_d48 * local_d48) / (local_d48 * local_d48 + 1.0);
          Eigen::DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator<<
                    (&local_d70,
                     (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                     (TF2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                      m_data.array + 0xe),&local_d74);
          local_d78 = (local_d48 * -2.0) / (local_d48 * local_d48 + 1.0);
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (&local_d70,&local_d78);
          local_d7c = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_d7c);
          local_d80 = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_d80);
          local_d84 = (local_d48 + local_d48) / (local_d48 * local_d48 + 1.0);
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_d84);
          local_d88 = (1.0 - local_d48 * local_d48) / (local_d48 * local_d48 + 1.0);
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_d88);
          local_d8c = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_d8c);
          local_d90 = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_d90);
          local_d94 = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_d94);
          local_d98 = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_d98);
          local_d9c = 1.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_d9c);
          local_da0 = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_da0);
          local_da4 = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_da4);
          local_da8 = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_da8);
          local_dac = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_dac);
          local_db0 = 1.0;
          Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                    (pCVar8,&local_db0);
          Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::~CommaInitializer
                    (&local_d70);
          local_e28 = (XprTypeNested)
                      Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::inverse
                                ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                                 (TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array + 0xe));
          local_e20 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>>::operator*
                                ((MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>> *)
                                 &local_e28,
                                 (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                                 (TF2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array + 0xe));
          Eigen::
          MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Matrix<float,4,4,0,4,4>,0>>
          ::operator*(&local_e10,
                      (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Matrix<float,4,4,0,4,4>,0>>
                       *)&local_e20,
                      (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                      (transLineU.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array + 0x22));
          Eigen::Matrix<float,4,4,0,4,4>::
          Matrix<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>>
                    ((Matrix<float,4,4,0,4,4> *)&local_df8,
                     (EigenBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                      *)&local_e10);
          std::
          vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          ::push_back(__return_storage_ptr__,&local_df8);
          local_e4c = (1.0 - local_d4c * local_d4c) / (local_d4c * local_d4c + 1.0);
          Eigen::DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator<<
                    (&local_e48,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&l12,&local_e4c);
          local_e50 = (local_d4c * -2.0) / (local_d4c * local_d4c + 1.0);
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (&local_e48,&local_e50);
          local_e54 = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_e54);
          local_e58 = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_e58);
          local_e5c = (local_d4c + local_d4c) / (local_d4c * local_d4c + 1.0);
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_e5c);
          local_e60 = (1.0 - local_d4c * local_d4c) / (local_d4c * local_d4c + 1.0);
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_e60);
          local_e64 = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_e64);
          local_e68 = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_e68);
          local_e6c = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_e6c);
          local_e70 = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_e70);
          local_e74 = 1.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_e74);
          local_e78 = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_e78);
          local_e7c = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_e7c);
          local_e80 = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_e80);
          local_e84 = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                             (pCVar8,&local_e84);
          local_e88 = 1.0;
          Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                    (pCVar8,&local_e88);
          Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::~CommaInitializer
                    (&local_e48);
          local_ef8 = (XprTypeNested)
                      Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::inverse
                                ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                                 (TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array + 0xe));
          local_ef0 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>>::operator*
                                ((MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>> *)
                                 &local_ef8,(MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&l12
                                );
          Eigen::
          MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Matrix<float,4,4,0,4,4>,0>>
          ::operator*(&local_ee0,
                      (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Matrix<float,4,4,0,4,4>,0>>
                       *)&local_ef0,
                      (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                      (transLineU.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array + 0x22));
          Eigen::Matrix<float,4,4,0,4,4>::
          Matrix<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>>
                    ((Matrix<float,4,4,0,4,4> *)&local_ec8,
                     (EigenBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                      *)&local_ee0);
          std::
          vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          ::push_back(__return_storage_ptr__,&local_ec8);
        }
        tP1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1].
        _3_1_ = 1;
        std::
        vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
        ::~vector((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                   *)local_530);
        if ((tP1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1]._3_1_ & 1) == 0) {
          std::
          vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          ::~vector(__return_storage_ptr__);
        }
        return __return_storage_ptr__;
      }
    }
  }
  this_07 = std::operator<<((ostream *)&std::cerr,
                            "Solver 1L1Q1P requires at least 1 point, 1 plane, and 1 line pair!");
  std::ostream::operator<<(this_07,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> solver1L1Q1P(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair)
{
	// check input vectors size
	if(ptPair.size() < 1 || lPair.size() < 1 || plPair.size() < 1){
		std::cerr << "Solver 1L1Q1P requires at least 1 point, 1 plane, and 1 line pair!" << std::endl;
		exit(-1);
	}

	// parse inputs
	Eigen::Matrix<floatPrec,4,1> P1,P1_B,Pi,Pi_B,Q1,Q2,R1_B,R2_B;
	P1 = ptPair[0].first; P1_B = ptPair[0].second;
	Pi = plPair[0].first; Pi_B = plPair[0].second;

	Q1 = lPair[0].first.first; Q2 = lPair[0].first.second;
	R1_B = lPair[0].second.first; R2_B = lPair[0].second.second;

	// initialize the transformation matrix
	vector<Matrix<floatPrec, 4,4>> out;

	Matrix<floatPrec, 3,1> tP1, tP2, tQ1, tQ2;
	tP1 = Q1.head(3) / Q1(3);
	tP2 = Q2.head(3) / Q2(3);
	tQ1 = R1_B.head(3) / R1_B(3);
	tQ2 = R2_B.head(3) / R2_B(3);

	// computing the plucker coordinates of the lines
	// starting from line 1
	Matrix<floatPrec, 3,1> D1 = tP2 - tP1;
	Matrix<floatPrec, 6,1> L1;
	L1.head(3) = D1;
	L1.tail(3) = tP2.cross(tP1);
	L1 /= L1.head(3).norm();
	// starting from line 2
	Matrix<floatPrec, 3,1> D2 = tQ2 - tQ1;
	Matrix<floatPrec, 6,1> L2;
	L2.head(3) = D2;
	L2.tail(3) = tQ2.cross(tQ1);
	L2 /= L2.head(3).norm();

	// compute predefined transformations
	vector<Matrix<floatPrec, 4,4>> predTrans = getPredefinedTransformations1L1Q1P<floatPrec>(P1, P1_B, Pi, Pi_B);

	Matrix<floatPrec, 4,4> TV = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4,4> TU = predTrans.back();
	predTrans.pop_back();

	// transform lines to predefined frames
	Matrix<floatPrec, 6,6> transLineU, transLineV;
	transLineU.setZero();
	transLineV.setZero();
	transLineU.topLeftCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomRightCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TU.col(3).head(3)) * TU.topLeftCorner(3, 3);
	transLineV.topLeftCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomRightCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TV.col(3).head(3)) * TV.topLeftCorner(3, 3);

	Matrix<floatPrec, 6,1> L1_2, L2_2;
	L1_2 = transLineU * L1;
	L2_2 = transLineV * L2;

	// compute rotation around Z axis
	// initialize two transformation solutions
	Matrix<floatPrec, 4,4> TF1, TF2;
	TF1.setIdentity(4,4);
	TF2.setIdentity(4,4);

	// compute polynomial coefficients
	floatPrec l11, l12, l13, l14, l15, l16, l21, l22, l23, l24, l25, l26;
	l11 = L1_2[0];
	l12 = L1_2[1];
	l13 = L1_2[2];
	l14 = L1_2[3];
	l15 = L1_2[4];
	l16 = L1_2[5];
	l21 = L2_2[0];
	l22 = L2_2[1];
	l23 = L2_2[2];
	l24 = L2_2[3];
	l25 = L2_2[4];
	l26 = L2_2[5];
	floatPrec a, b, c;
	a = l13 * l26 - l14 * l21 - l12 * l25 - l15 * l22 - l11 * l24 + l16 * l23;
	b = 2 * l11 * l25 - 2 * l12 * l24 + 2 * l14 * l22 - 2 * l15 * l21;
	c = l11 * l24 + l12 * l25 + l13 * l26 + l14 * l21 + l15 * l22 + l16 * l23;

	// apply quadratic formula
	floatPrec s1, s2;
	s1 = (-b - sqrt(b * b - 4 * a * c)) / (2 * a);
	s2 = (-b + sqrt(b * b - 4 * a * c)) / (2 * a);

	if(!isnan(s1)){
		TF1 << (1 - s1 * s1) / (1 + s1 * s1), -2 * s1 / (1 + s1 * s1), 0, 0,
			2 * s1 / (1 + s1 * s1), (1 - s1 * s1) / (1 + s1 * s1), 0, 0,
			0, 0, 1, 0,
			0, 0, 0, 1;
		out.push_back(TV.inverse() * TF1 * TU);
		TF2 << (1 - s2 * s2) / (1 + s2 * s2), -2 * s2 / (1 + s2 * s2), 0, 0,
			2 * s2 / (1 + s2 * s2), (1 - s2 * s2) / (1 + s2 * s2), 0, 0,
			0, 0, 1, 0,
			0, 0, 0, 1;
		out.push_back(TV.inverse() * TF2 * TU);


	}
	return out;
}